

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

void __thiscall toml::syntax_error::~syntax_error(syntax_error *this)

{
  ~syntax_error(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

~syntax_error() noexcept override = default;